

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O1

void Abc_NtkModelToVector(Abc_Ntk_t *pNtk,Vec_Int_t *vPiValues)

{
  Vec_Ptr_t *pVVar1;
  int *piVar2;
  long lVar3;
  
  pVVar1 = pNtk->vPis;
  if (0 < pVVar1->nSize) {
    piVar2 = pNtk->pModel;
    lVar3 = 0;
    do {
      if (vPiValues->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vPiValues->pArray[lVar3] = piVar2[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Abc_NtkModelToVector( Abc_Ntk_t * pNtk, Vec_Int_t * vPiValues )
{
    int * pModel, i;
    pModel = pNtk->pModel;
    for ( i = 0; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, pModel[i] );
}